

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# licensecc.cpp
# Opt level: O0

LCC_EVENT_TYPE
acquire_license(CallerInformations *callerInformation,LicenseLocation *licenseLocation,
               LicenseInfo_conflict *license_out)

{
  uint uVar1;
  bool bVar2;
  FUNCTION_RETURN FVar3;
  size_t sVar4;
  size_type sVar5;
  pointer pFVar6;
  reference pFVar7;
  AuditEvent_conflict *pAVar8;
  double __x;
  undefined1 local_1b20 [8];
  string evlog;
  undefined1 local_1af4 [8];
  LicenseInfo_conflict licInfo;
  FUNCTION_RETURN signatureValid;
  __normal_iterator<license::FullLicenseInfo_*,_std::vector<license::FullLicenseInfo,_std::allocator<license::FullLicenseInfo>_>_>
  local_190;
  iterator full_lic_info_it;
  LicenseVerifier verifier;
  vector<LicenseInfo,_std::allocator<LicenseInfo>_> licenses_ok;
  vector<LicenseInfo,_std::allocator<LicenseInfo>_> licenses_with_errors;
  undefined1 local_140 [4];
  LCC_EVENT_TYPE result;
  undefined1 local_120 [8];
  EventRegistry er;
  string local_c8 [39];
  allocator local_a1;
  string local_a0 [48];
  size_t local_70;
  size_t str_size;
  string project;
  vector<license::FullLicenseInfo,_std::allocator<license::FullLicenseInfo>_> licenses;
  LicenseReader lr;
  LicenseInfo_conflict *license_out_local;
  LicenseLocation *licenseLocation_local;
  CallerInformations *callerInformation_local;
  
  license::LicenseReader::LicenseReader
            ((LicenseReader *)
             &licenses.
              super__Vector_base<license::FullLicenseInfo,_std::allocator<license::FullLicenseInfo>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,licenseLocation);
  std::vector<license::FullLicenseInfo,_std::allocator<license::FullLicenseInfo>_>::vector
            ((vector<license::FullLicenseInfo,_std::allocator<license::FullLicenseInfo>_> *)
             ((long)&project.field_2 + 8));
  std::__cxx11::string::string((string *)&str_size);
  if ((callerInformation == (CallerInformations *)0x0) ||
     (sVar4 = license::mstrnlen_s(callerInformation->feature_name,0x10), local_70 = sVar4,
     sVar4 == 0)) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_c8,"DEFAULT",(allocator *)&er.field_0x4f);
    std::__cxx11::string::operator=((string *)&str_size,local_c8);
    std::__cxx11::string::~string(local_c8);
    std::allocator<char>::~allocator((allocator<char> *)&er.field_0x4f);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_a0,callerInformation->feature_name,sVar4,&local_a1);
    std::__cxx11::string::operator=((string *)&str_size,local_a0);
    std::__cxx11::string::~string(local_a0);
    std::allocator<char>::~allocator((allocator<char> *)&local_a1);
  }
  std::__cxx11::string::string((string *)local_140,(string *)&str_size);
  license::LicenseReader::readLicenses
            ((EventRegistry *)local_120,
             (LicenseReader *)
             &licenses.
              super__Vector_base<license::FullLicenseInfo,_std::allocator<license::FullLicenseInfo>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,(string *)local_140,
             (vector<license::FullLicenseInfo,_std::allocator<license::FullLicenseInfo>_> *)
             ((long)&project.field_2 + 8));
  std::__cxx11::string::~string((string *)local_140);
  sVar5 = std::vector<license::FullLicenseInfo,_std::allocator<license::FullLicenseInfo>_>::size
                    ((vector<license::FullLicenseInfo,_std::allocator<license::FullLicenseInfo>_> *)
                     ((long)&project.field_2 + 8));
  if (sVar5 == 0) {
    license::EventRegistry::turnWarningsIntoErrors((EventRegistry *)local_120);
    pAVar8 = license::EventRegistry::getLastFailure((EventRegistry *)local_120);
    licenses_with_errors.super__Vector_base<LicenseInfo,_std::allocator<LicenseInfo>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._4_4_ = pAVar8->event_type;
    if (license_out != (LicenseInfo_conflict *)0x0) {
      license_out->proprietary_data[0] = '\0';
      license_out->linked_to_pc = false;
      license_out->days_left = 0;
    }
  }
  else {
    std::vector<LicenseInfo,_std::allocator<LicenseInfo>_>::vector
              ((vector<LicenseInfo,_std::allocator<LicenseInfo>_> *)
               &licenses_ok.super__Vector_base<LicenseInfo,_std::allocator<LicenseInfo>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    std::vector<LicenseInfo,_std::allocator<LicenseInfo>_>::vector
              ((vector<LicenseInfo,_std::allocator<LicenseInfo>_> *)&verifier.m_event_registry);
    license::LicenseVerifier::LicenseVerifier
              ((LicenseVerifier *)&full_lic_info_it,(EventRegistry *)local_120);
    local_190._M_current =
         (FullLicenseInfo *)
         std::vector<license::FullLicenseInfo,_std::allocator<license::FullLicenseInfo>_>::begin
                   ((vector<license::FullLicenseInfo,_std::allocator<license::FullLicenseInfo>_> *)
                    ((long)&project.field_2 + 8));
    while( true ) {
      register0x00000000 =
           std::vector<license::FullLicenseInfo,_std::allocator<license::FullLicenseInfo>_>::end
                     ((vector<license::FullLicenseInfo,_std::allocator<license::FullLicenseInfo>_> *
                      )((long)&project.field_2 + 8));
      bVar2 = __gnu_cxx::operator!=
                        (&local_190,
                         (__normal_iterator<license::FullLicenseInfo_*,_std::vector<license::FullLicenseInfo,_std::allocator<license::FullLicenseInfo>_>_>
                          *)&licInfo.license_version);
      if (!bVar2) break;
      if (callerInformation != (CallerInformations *)0x0) {
        uVar1 = callerInformation->magic;
        pFVar6 = __gnu_cxx::
                 __normal_iterator<license::FullLicenseInfo_*,_std::vector<license::FullLicenseInfo,_std::allocator<license::FullLicenseInfo>_>_>
                 ::operator->(&local_190);
        pFVar6->m_magic = uVar1;
      }
      pFVar7 = __gnu_cxx::
               __normal_iterator<license::FullLicenseInfo_*,_std::vector<license::FullLicenseInfo,_std::allocator<license::FullLicenseInfo>_>_>
               ::operator*(&local_190);
      licInfo._6480_4_ =
           license::LicenseVerifier::verify_signature((LicenseVerifier *)&full_lic_info_it,pFVar7);
      pFVar7 = __gnu_cxx::
               __normal_iterator<license::FullLicenseInfo_*,_std::vector<license::FullLicenseInfo,_std::allocator<license::FullLicenseInfo>_>_>
               ::operator*(&local_190);
      license::LicenseVerifier::toLicenseInfo
                ((LicenseInfo *)local_1af4,(LicenseVerifier *)&full_lic_info_it,pFVar7);
      if (licInfo._6480_4_ == 0) {
        pFVar7 = __gnu_cxx::
                 __normal_iterator<license::FullLicenseInfo_*,_std::vector<license::FullLicenseInfo,_std::allocator<license::FullLicenseInfo>_>_>
                 ::operator*(&local_190);
        FVar3 = license::LicenseVerifier::verify_limits((LicenseVerifier *)&full_lic_info_it,pFVar7)
        ;
        if (FVar3 == FUNC_RET_OK) {
          std::vector<LicenseInfo,_std::allocator<LicenseInfo>_>::push_back
                    ((vector<LicenseInfo,_std::allocator<LicenseInfo>_> *)&verifier.m_event_registry
                     ,(value_type *)local_1af4);
        }
        else {
          std::vector<LicenseInfo,_std::allocator<LicenseInfo>_>::push_back
                    ((vector<LicenseInfo,_std::allocator<LicenseInfo>_> *)
                     &licenses_ok.super__Vector_base<LicenseInfo,_std::allocator<LicenseInfo>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage,(value_type *)local_1af4);
        }
      }
      else {
        std::vector<LicenseInfo,_std::allocator<LicenseInfo>_>::push_back
                  ((vector<LicenseInfo,_std::allocator<LicenseInfo>_> *)
                   &licenses_ok.super__Vector_base<LicenseInfo,_std::allocator<LicenseInfo>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage,(value_type *)local_1af4);
      }
      evlog.field_2._8_8_ =
           __gnu_cxx::
           __normal_iterator<license::FullLicenseInfo_*,_std::vector<license::FullLicenseInfo,_std::allocator<license::FullLicenseInfo>_>_>
           ::operator++(&local_190,0);
    }
    sVar5 = std::vector<LicenseInfo,_std::allocator<LicenseInfo>_>::size
                      ((vector<LicenseInfo,_std::allocator<LicenseInfo>_> *)
                       &verifier.m_event_registry);
    if (sVar5 == 0) {
      license::EventRegistry::turnWarningsIntoErrors((EventRegistry *)local_120);
      pAVar8 = license::EventRegistry::getLastFailure((EventRegistry *)local_120);
      licenses_with_errors.super__Vector_base<LicenseInfo,_std::allocator<LicenseInfo>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._4_4_ = pAVar8->event_type;
      mergeLicenses((vector<LicenseInfo,_std::allocator<LicenseInfo>_> *)
                    &licenses_ok.super__Vector_base<LicenseInfo,_std::allocator<LicenseInfo>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage,license_out);
    }
    else {
      license::EventRegistry::turnErrorsIntoWarnings((EventRegistry *)local_120);
      licenses_with_errors.super__Vector_base<LicenseInfo,_std::allocator<LicenseInfo>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._4_4_ = LICENSE_OK;
      mergeLicenses((vector<LicenseInfo,_std::allocator<LicenseInfo>_> *)&verifier.m_event_registry,
                    license_out);
    }
    license::LicenseVerifier::~LicenseVerifier((LicenseVerifier *)&full_lic_info_it);
    std::vector<LicenseInfo,_std::allocator<LicenseInfo>_>::~vector
              ((vector<LicenseInfo,_std::allocator<LicenseInfo>_> *)&verifier.m_event_registry);
    std::vector<LicenseInfo,_std::allocator<LicenseInfo>_>::~vector
              ((vector<LicenseInfo,_std::allocator<LicenseInfo>_> *)
               &licenses_ok.super__Vector_base<LicenseInfo,_std::allocator<LicenseInfo>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
  }
  license::EventRegistry::to_string_abi_cxx11_((string *)local_1b20,(EventRegistry *)local_120);
  __x = (double)std::__cxx11::string::c_str();
  _log(__x);
  if (license_out != (LicenseInfo_conflict *)0x0) {
    license::EventRegistry::exportLastEvents
              ((EventRegistry *)local_120,(AuditEvent_conflict *)license_out,5);
  }
  std::__cxx11::string::~string((string *)local_1b20);
  license::EventRegistry::~EventRegistry((EventRegistry *)local_120);
  std::__cxx11::string::~string((string *)&str_size);
  std::vector<license::FullLicenseInfo,_std::allocator<license::FullLicenseInfo>_>::~vector
            ((vector<license::FullLicenseInfo,_std::allocator<license::FullLicenseInfo>_> *)
             ((long)&project.field_2 + 8));
  license::LicenseReader::~LicenseReader
            ((LicenseReader *)
             &licenses.
              super__Vector_base<license::FullLicenseInfo,_std::allocator<license::FullLicenseInfo>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  return licenses_with_errors.super__Vector_base<LicenseInfo,_std::allocator<LicenseInfo>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage._4_4_;
}

Assistant:

LCC_EVENT_TYPE acquire_license(const CallerInformations* callerInformation, const LicenseLocation* licenseLocation,
							   LicenseInfo* license_out) {
	const license::LicenseReader lr = license::LicenseReader(licenseLocation);
	vector<license::FullLicenseInfo> licenses;
	string project;
	size_t str_size;
	if (callerInformation != nullptr &&
		(str_size = license::mstrnlen_s(callerInformation->feature_name, sizeof callerInformation->feature_name)) > 0) {
		project = string(callerInformation->feature_name, str_size);
	} else {
		project = string(LCC_PROJECT_NAME);
	}
	license::EventRegistry er = lr.readLicenses(string(project), licenses);
	LCC_EVENT_TYPE result;
	if (licenses.size() > 0) {
		vector<LicenseInfo> licenses_with_errors;
		vector<LicenseInfo> licenses_ok;
		license::LicenseVerifier verifier(er);
		for (auto full_lic_info_it = licenses.begin(); full_lic_info_it != licenses.end(); full_lic_info_it++) {
			if (callerInformation != nullptr) {
				full_lic_info_it->m_magic = callerInformation->magic;
			}
			const FUNCTION_RETURN signatureValid = verifier.verify_signature(*full_lic_info_it);
			LicenseInfo licInfo = verifier.toLicenseInfo(*full_lic_info_it);
			if (signatureValid == FUNC_RET_OK) {
				if (verifier.verify_limits(*full_lic_info_it) == FUNC_RET_OK) {
					licenses_ok.push_back(licInfo);
				} else {
					licenses_with_errors.push_back(licInfo);
				}
			} else {
				licenses_with_errors.push_back(licInfo);
			}
		}
		if (licenses_ok.size() > 0) {
			er.turnErrorsIntoWarnings();
			result = LICENSE_OK;
			mergeLicenses(licenses_ok, license_out);
		} else {
			er.turnWarningsIntoErrors();
			result = er.getLastFailure()->event_type;
			mergeLicenses(licenses_with_errors, license_out);
		}
	} else {
		er.turnWarningsIntoErrors();
		result = er.getLastFailure()->event_type;
		if (license_out != nullptr) {
			license_out->proprietary_data[0] = '\0';
			license_out->linked_to_pc = false;
			license_out->days_left = 0;
		}
	}
#ifndef NDEBUG
	const string evlog = er.to_string();
	LOG_DEBUG("License status %s", evlog.c_str());
#endif

	if (license_out != nullptr) {
		er.exportLastEvents(license_out->status, LCC_API_AUDIT_EVENT_NUM);
	}
	return result;
}